

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
check_absent_keys<unsigned_long>
          (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,initializer_list<unsigned_long> absent_keys)

{
  _Rb_tree_header *p_Var1;
  ulong *puVar2;
  ulong uVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  ulong *puVar6;
  char *message;
  internal local_58 [8];
  AssertionResult gtest_ar;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_40;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_38;
  
  puVar6 = absent_keys._M_array;
  if (absent_keys._M_len != 0) {
    puVar2 = puVar6 + absent_keys._M_len;
    p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
    do {
      uVar3 = *puVar6;
      p_Var4 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
          p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar3]) {
        if (*(ulong *)(p_Var4 + 1) >= uVar3) {
          p_Var5 = p_Var4;
        }
      }
      local_40._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (local_40._M_node = p_Var5, uVar3 < *(ulong *)(p_Var5 + 1))) {
        local_40._M_node = &p_Var1->_M_header;
      }
      local_38._M_node = &p_Var1->_M_header;
      testing::internal::
      CmpHelperEQ<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                (local_58,"(values.find(to_ikey(k)))","(values.cend())",&local_40,&local_38);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (gtest_ar._0_8_ == 0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x288,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
        if (local_40._M_node != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_40._M_node + 8))();
        }
        if (gtest_ar._0_8_ == 0) {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
        return;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
                ((get_result *)local_58,&this->test_db,
                 (art_key_type)
                 (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                 | uVar3 << 0x38));
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  return;
}

Assistant:

void check_absent_keys(std::initializer_list<T> absent_keys) noexcept(
      noexcept(this->try_get(coerce_key(*absent_keys.begin())))) {
    for (const auto absent_key : absent_keys) {
      const auto k{coerce_key(absent_key)};
      UNODB_ASSERT_EQ(values.find(to_ikey(k)), values.cend());
      try_get(k);
    }
  }